

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.hpp
# Opt level: O2

size_t JEBDebug::internal::print_hex_numbers
                 (ostream *stream,void *data,size_t num_bytes,size_t num_numbers)

{
  uint uVar1;
  long lVar2;
  ostream oVar3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  
  lVar6 = *(long *)stream;
  lVar2 = *(long *)(lVar6 + -0x18);
  uVar1 = *(uint *)(stream + lVar2 + 0x18);
  *(uint *)(stream + lVar2 + 0x18) = uVar1 & 0xffffffb5 | 8;
  lVar6 = *(long *)(lVar6 + -0x18);
  oVar3 = (ostream)std::ios::fill();
  stream[lVar6 + 0xe0] = (ostream)0x30;
  if (num_numbers < num_bytes) {
    num_bytes = num_numbers;
  }
  for (sVar5 = 0; num_bytes != sVar5; sVar5 = sVar5 + 1) {
    poVar4 = std::operator<<(stream,' ');
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  }
  lVar6 = num_numbers + num_bytes * -2 + sVar5;
  while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
    std::operator<<(stream,"   ");
  }
  lVar6 = *(long *)(*(long *)stream + -0x18);
  std::ios::fill();
  stream[lVar6 + 0xe0] = oVar3;
  *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) = uVar1;
  return num_bytes;
}

Assistant:

inline size_t print_hex_numbers(std::ostream& stream,
                                        const void* data, size_t num_bytes,
                                        size_t num_numbers)
        {
            auto flags = stream.setf(std::ios::hex, std::ios::basefield);
            auto fill = stream.fill('0');
            size_t i = 0;
            auto n = std::min(num_bytes, num_numbers);
            const auto* cdata = static_cast<const unsigned char*>(data);
            for (; i < n; ++i)
                stream << ' ' << std::setw(2) << unsigned(cdata[i]);
            for (; i < num_numbers; ++i)
                stream << "   ";
            stream.fill(fill);
            stream.flags(flags);
            return n;
        }